

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RP5C01.cpp
# Opt level: O2

ssize_t __thiscall Ricoh::RP5C01::RP5C01::read(RP5C01 *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = __fd & 0xf;
  uVar1 = this->mode_;
  if (1 < (int)uVar1 && uVar8 < 0xd) {
    lVar5 = 0xd;
    if (uVar1 != 3) {
      lVar5 = 0;
    }
    uVar3 = (ulong)(this->ram_)._M_elems[(ulong)uVar8 + lVar5];
    goto switchD_0019d9ef_caseD_e;
  }
  uVar7 = uVar1 << 4 | uVar8;
  uVar3 = 0xf;
  switch(uVar7) {
  case 0:
    iVar2 = this->seconds_;
    goto LAB_0019dab5;
  case 1:
    iVar2 = this->seconds_;
    iVar4 = 10;
    goto LAB_0019da93;
  case 2:
    iVar2 = this->seconds_ / 0x3c;
    goto LAB_0019dab5;
  case 3:
    iVar2 = this->seconds_;
    iVar4 = 600;
LAB_0019da93:
    iVar2 = iVar2 / iVar4;
    iVar4 = 6;
    goto LAB_0019dac3;
  case 4:
  case 5:
    uVar3 = (long)this->seconds_ / 0xe10;
    lVar5 = (long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) % 0x18;
    cVar6 = (char)lVar5;
    if (this->twentyfour_hour_clock_ == false) {
      iVar2 = anon_unknown.dwarf_5048dd::twenty_four_to_twelve((int)lVar5);
      cVar6 = (char)iVar2;
    }
    if (uVar8 == 4) {
      uVar3 = (ulong)(byte)(cVar6 % '\n');
    }
    else {
      uVar3 = (ulong)(byte)(cVar6 / '\n');
    }
    break;
  case 6:
    uVar3 = (ulong)(uint)this->day_of_the_week_;
    break;
  case 7:
    iVar2 = this->day_;
    goto LAB_0019dab5;
  case 8:
    iVar2 = this->day_;
    goto LAB_0019dabd;
  case 9:
    iVar2 = this->month_ + 1;
    goto LAB_0019dab5;
  case 10:
    iVar2 = this->month_ + 1;
    goto LAB_0019dabd;
  case 0xb:
    iVar2 = this->year_;
LAB_0019dab5:
    iVar4 = 10;
LAB_0019dac3:
    uVar3 = (long)iVar2 % (long)iVar4 & 0xffffffff;
    break;
  case 0xc:
    iVar2 = this->year_;
LAB_0019dabd:
    iVar4 = 10;
    iVar2 = iVar2 / 10;
    goto LAB_0019dac3;
  case 0xd:
  case 0x1d:
  case 0x2d:
    goto switchD_0019d9ef_caseD_d;
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1c:
  case 0x1e:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2e:
    break;
  case 0xf:
  case 0x1f:
  case 0x2f:
switchD_0019d9ef_caseD_f:
    uVar3 = (ulong)((this->one_hz_on_ ^ 1) * 8 + (this->sixteen_hz_on_ ^ 1) * 4);
    break;
  case 0x1a:
    uVar3 = (ulong)this->twentyfour_hour_clock_;
    break;
  case 0x1b:
    uVar3 = (ulong)(uint)this->leap_year_;
    break;
  default:
    if (uVar7 != 0x3d) {
      if (uVar7 != 0x3f) break;
      goto switchD_0019d9ef_caseD_f;
    }
    goto switchD_0019d9ef_caseD_d;
  }
switchD_0019d9ef_caseD_e:
  return uVar3 | 0xf0;
switchD_0019d9ef_caseD_d:
  uVar3 = (ulong)((uint)this->alarm_enabled_ * 4 + (uint)this->timer_enabled_ * 8 | uVar1);
  goto switchD_0019d9ef_caseD_e;
}

Assistant:

uint8_t RP5C01::read(int address) {
	address &= 0xf;

	if(address < 0xd && mode_ >= 2) {
		address += mode_ == 3 ? 13 : 0;
		return 0xf0 | ram_[size_t(address)];
	}

	int value = 0xf;
	switch(Reg(mode_, address)) {
		// Second.
		case Reg(0, 0x00):	value = SecondEncoder::decode<0>(seconds_);	break;
		case Reg(0, 0x01):	value = SecondEncoder::decode<1>(seconds_);	break;

		// Minute.
		case Reg(0, 0x02):	value = SecondEncoder::decode<2>(seconds_);	break;
		case Reg(0, 0x03):	value = SecondEncoder::decode<3>(seconds_);	break;

		// Hour.
		case Reg(0, 0x04):
		case Reg(0, 0x05): {
			int hours = SecondEncoder::decode<4>(seconds_);
			if(!twentyfour_hour_clock_) {
				hours = twenty_four_to_twelve(hours);
			}
			if(address == 0x4) {
				value = TwoDigitEncoder::decode<0>(hours);
			} else {
				value = TwoDigitEncoder::decode<1>(hours);
			}
		} break;

		// Day-of-the-week.
		case Reg(0, 0x06):	value = day_of_the_week_;	break;

		// Day.
		case Reg(0, 0x07):	value = TwoDigitEncoder::decode<0>(day_);		break;
		case Reg(0, 0x08):	value = TwoDigitEncoder::decode<1>(day_);		break;

		// Month.
		case Reg(0, 0x09):	value = TwoDigitEncoder::decode<0>(month_ + 1);	break;
		case Reg(0, 0x0a):	value = TwoDigitEncoder::decode<1>(month_ + 1);	break;

		// Year.
		case Reg(0, 0x0b):	value = TwoDigitEncoder::decode<0>(year_);		break;
		case Reg(0, 0x0c):	value = TwoDigitEncoder::decode<1>(year_);		break;

		// TODO: alarm minutes.
		case Reg(1, 0x02):
		case Reg(1, 0x03):	break;

		// TODO: alarm hours.
		case Reg(1, 0x04):
		case Reg(1, 0x05):	break;

		// TODO: alarm day-of-the-week.
		case Reg(1, 0x06):	break;

		// TODO: alarm day.
		case Reg(1, 0x07):
		case Reg(1, 0x08):	break;

		// 12/24-hour clock.
		case Reg(1, 0x0a):	value = twentyfour_hour_clock_;	break;

		// Leap year.
		case Reg(1, 0x0b):	value = leap_year_;				break;

		//
		// Registers D–F don't depend on the mode.
		//

		case Reg(0, 0xd):	case Reg(1, 0xd):	case Reg(2, 0xd):	case Reg(3, 0xd):
			value =
				(timer_enabled_ ? 0x8 : 0x0) |
				(alarm_enabled_ ? 0x4 : 0x0) |
				mode_;
		break;
		case Reg(0, 0xe):	case Reg(1, 0xe):	case Reg(2, 0xe):	case Reg(3, 0xe):
			// Test register; unclear what is supposed to happen.
		break;
		case Reg(0, 0xf):	case Reg(1, 0xf):	case Reg(2, 0xf):	case Reg(3, 0xf):
			value =
				(one_hz_on_ ? 0x0 : 0x8) |
				(sixteen_hz_on_ ? 0x0 : 0x4);
		break;
	}

	return uint8_t(0xf0 | value);
}